

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

void __thiscall libtorrent::aux::utp_socket_impl::send_reset(utp_socket_impl *this,uint16_t ack_nr)

{
  _Atomic_word *p_Var1;
  utp_socket_manager *this_00;
  byte bVar2;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  unsigned_short val;
  int iVar10;
  long lVar11;
  uint val_1;
  uint uVar12;
  utp_header h;
  error_code ec;
  char local_74 [2];
  ushort local_72;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  weak_ptr<libtorrent::aux::utp_socket_interface> local_60;
  error_code local_50;
  basic_endpoint<boost::asio::ip::udp> local_3c;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  
  local_74[0] = '1';
  local_74[1] = '\0';
  local_72 = this->m_send_id << 8 | this->m_send_id >> 8;
  uVar12 = this->m_reply_micro;
  uVar7 = (ushort)(uVar12 >> 0x10) & 0xff;
  uVar8 = (ushort)(uVar12 >> 8) & 0xff;
  uVar9 = (ushort)uVar12 & 0xff;
  bVar2 = (byte)(uVar12 >> 0x18);
  uVar6 = (ushort)bVar2;
  bVar2 = (uVar6 != 0) * (uVar6 < 0x100) * bVar2 - (0xff < uVar6);
  bVar3 = ((uVar12 & 0xff0000) != 0) * (uVar7 < 0x100) * (char)(uVar12 >> 0x10) - (0xff < uVar7);
  bVar4 = ((uVar12 & 0xff00) != 0) * (uVar8 < 0x100) * (char)(uVar12 >> 8) - (0xff < uVar8);
  bVar5 = ((uVar12 & 0xff) != 0) * (uVar9 < 0x100) * (char)uVar12 - (0xff < uVar9);
  local_6c = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                      CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                               CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                        (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2))));
  local_68 = 0;
  lVar11 = random((aux *)0xffff);
  local_64 = (undefined1)((ulong)lVar11 >> 8);
  local_63 = (undefined1)lVar11;
  local_62 = (undefined1)(ack_nr >> 8);
  local_61 = (undefined1)ack_nr;
  lVar11 = ::std::chrono::_V2::system_clock::now();
  uVar12 = (int)(SUB168(SEXT816(lVar11) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
           (SUB164(SEXT816(lVar11) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f);
  uVar7 = (ushort)((uVar12 & 0xff00ff) >> 0x10);
  uVar8 = (ushort)(uVar12 >> 8) & 0xff;
  uVar9 = (ushort)(uVar12 & 0xff00ff);
  bVar2 = (byte)(uVar12 >> 0x18);
  uVar6 = (ushort)bVar2;
  bVar2 = (uVar6 != 0) * (uVar6 < 0x100) * bVar2 - (0xff < uVar6);
  bVar3 = ((uVar12 & 0xff0000) != 0) * (uVar7 < 0x100) * (char)(uVar12 >> 0x10) - (0xff < uVar7);
  bVar4 = ((uVar12 & 0xff00) != 0) * (uVar8 < 0x100) * (char)(uVar12 >> 8) - (0xff < uVar8);
  bVar5 = ((uVar12 & 0xff) != 0) * (uVar9 < 0x100) * (char)uVar12 - (0xff < uVar9);
  local_70 = CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                      CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                               CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                        (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2))));
  local_50.val_ = 0;
  local_50.failed_ = false;
  local_50.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->m_sock).
           super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = this->m_sm;
  local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->m_sock).
       super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_60.
            super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_60.
            super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_3c,&this->m_remote_address,this->m_port);
  utp_socket_manager::send_packet
            (this_00,&local_60,&local_3c,local_74,0x14,&local_50,(udp_send_flags_t)0x0);
  if (local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_60.
                 super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_weak_count;
      iVar10 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar10 = (local_60.
                super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_weak_count;
      (local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar10 + -1;
    }
    if (iVar10 == 1) {
      (*(local_60.
         super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void utp_socket_impl::send_reset(std::uint16_t const ack_nr)
{
	INVARIANT_CHECK;

	utp_header h;
	h.type_ver = (ST_RESET << 4) | 1;
	h.extension = utp_no_extension;
	h.connection_id = m_send_id;
	h.timestamp_difference_microseconds = m_reply_micro;
	h.wnd_size = 0;
	h.seq_nr = std::uint16_t(random(0xffff));
	h.ack_nr = ack_nr;
	time_point const now = clock_type::now();
	h.timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

	UTP_LOGV("%8p: send_reset seq_nr:%d id:%d ack_nr:%d\n"
		, static_cast<void*>(this), int(h.seq_nr), int(m_send_id), int(ack_nr));

	// ignore errors here
	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(&h), sizeof(h), ec);
	if (ec)
	{
		UTP_LOGV("%8p: socket error: %s\n"
			, static_cast<void*>(this)
			, ec.message().c_str());
	}
}